

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLHelper.hpp
# Opt level: O0

void writeToFile(string *str,string *fileName)

{
  byte bVar1;
  ostream local_218 [8];
  ofstream ofs;
  string *fileName_local;
  string *str_local;
  
  std::ofstream::ofstream(local_218,fileName,0x10);
  bVar1 = std::ios::fail();
  if (((bVar1 ^ 0xff) & 1) == 0) {
    __assert_fail("!ofs.fail()",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/XMLHelper.hpp"
                  ,0x234,"void writeToFile(const std::string &, const std::string &)");
  }
  std::operator<<(local_218,(string *)str);
  std::ofstream::close();
  std::ofstream::~ofstream(local_218);
  return;
}

Assistant:

void writeToFile( std::string const & str, std::string const & fileName )
{
  std::ofstream ofs( fileName );
  assert( !ofs.fail() );
  ofs << str;
  ofs.close();

#if defined( CLANG_FORMAT_EXECUTABLE )
  // explicitly flush std::cout, as std::system spawns a sub-process
  std::cout.flush();

  messager.message( "VulkanHppGenerator: Formatting " + fileName + " ...\n" );
  const std::string commandString = "\"" CLANG_FORMAT_EXECUTABLE "\" -i --style=file " + fileName;
  const int         ret           = std::system( commandString.c_str() );
  if ( ret != 0 )
  {
    throw std::runtime_error( "VulkanHppGenerator: failed to format file " + fileName + " with error <" + std::to_string( ret ) + ">" );
  }
#endif
}